

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandAbc9Fraig(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  Gia_Man_t *pGVar4;
  char *pcVar5;
  int iVar6;
  char *pcVar7;
  Cec_ParFra_t ParsFra;
  
  Cec_ManFraSetDefaultParams(&ParsFra);
  ParsFra.fSatSweeping = 1;
  ParsFra.nItersMax = 1000000;
  bVar1 = false;
  Extra_UtilGetoptReset();
  bVar2 = false;
  do {
    iVar3 = Extra_UtilGetopt(argc,argv,"WRILDCrmdckngwvh");
    iVar6 = globalUtilOptind;
    switch(iVar3) {
    case 99:
      ParsFra.fRunCSat = ParsFra.fRunCSat ^ 1;
      break;
    case 100:
      ParsFra.fDualOut = ParsFra.fDualOut ^ 1;
      break;
    case 0x65:
    case 0x66:
    case 0x68:
    case 0x69:
    case 0x6a:
    case 0x6c:
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x73:
    case 0x74:
    case 0x75:
      goto switchD_0024f2d5_caseD_65;
    case 0x67:
      bVar2 = (bool)(bVar2 ^ 1);
      break;
    case 0x6b:
      ParsFra.fUseCones = ParsFra.fUseCones ^ 1;
      break;
    case 0x6d:
      ParsFra.fCheckMiter = ParsFra.fCheckMiter ^ 1;
      break;
    case 0x6e:
      bVar1 = (bool)(bVar1 ^ 1);
      break;
    case 0x72:
      ParsFra.fRewriting = ParsFra.fRewriting ^ 1;
      break;
    case 0x76:
      ParsFra.fVerbose = ParsFra.fVerbose ^ 1;
      break;
    case 0x77:
      ParsFra.fVeryVerbose = ParsFra.fVeryVerbose ^ 1;
      break;
    default:
      switch(iVar3) {
      case 0x43:
        if (argc <= globalUtilOptind) {
          pcVar5 = "Command line switch \"-C\" should be followed by an integer.\n";
LAB_0024f469:
          Abc_Print(-1,pcVar5);
          goto switchD_0024f2d5_caseD_65;
        }
        iVar3 = atoi(argv[globalUtilOptind]);
        ParsFra.nBTLimit = iVar3;
        break;
      case 0x44:
        if (argc <= globalUtilOptind) {
          pcVar5 = "Command line switch \"-D\" should be followed by an integer.\n";
          goto LAB_0024f469;
        }
        iVar3 = atoi(argv[globalUtilOptind]);
        ParsFra.nDepthMax = iVar3;
        break;
      case 0x45:
      case 0x46:
      case 0x47:
      case 0x48:
      case 0x4a:
      case 0x4b:
        goto switchD_0024f2d5_caseD_65;
      case 0x49:
        if (argc <= globalUtilOptind) {
          pcVar5 = "Command line switch \"-I\" should be followed by an integer.\n";
          goto LAB_0024f469;
        }
        iVar3 = atoi(argv[globalUtilOptind]);
        ParsFra.nItersMax = iVar3;
        break;
      case 0x4c:
        if (argc <= globalUtilOptind) {
          pcVar5 = "Command line switch \"-L\" should be followed by an integer.\n";
          goto LAB_0024f469;
        }
        iVar3 = atoi(argv[globalUtilOptind]);
        ParsFra.nLevelMax = iVar3;
        break;
      default:
        if (iVar3 == 0x52) {
          if (argc <= globalUtilOptind) {
            pcVar5 = "Command line switch \"-R\" should be followed by an integer.\n";
            goto LAB_0024f469;
          }
          iVar3 = atoi(argv[globalUtilOptind]);
          ParsFra.nRounds = iVar3;
        }
        else {
          if (iVar3 != 0x57) {
            if (iVar3 == -1) {
              pGVar4 = pAbc->pGia;
              if (pGVar4 != (Gia_Man_t *)0x0) {
                if (bVar1) {
                  pGVar4 = Cec2_ManSimulateTest(pGVar4,&ParsFra);
                }
                else if (bVar2) {
                  pGVar4 = Cec3_ManSimulateTest(pGVar4,&ParsFra);
                }
                else {
                  pGVar4 = Cec_ManSatSweeping(pGVar4,&ParsFra,0);
                }
                Abc_FrameUpdateGia(pAbc,pGVar4);
                return 0;
              }
              pcVar5 = "Abc_CommandAbc9Fraig(): There is no AIG.\n";
              iVar6 = -1;
              goto LAB_0024f62b;
            }
            goto switchD_0024f2d5_caseD_65;
          }
          if (argc <= globalUtilOptind) {
            pcVar5 = "Command line switch \"-W\" should be followed by an integer.\n";
            goto LAB_0024f469;
          }
          iVar3 = atoi(argv[globalUtilOptind]);
          ParsFra.nWords = iVar3;
        }
      }
      globalUtilOptind = iVar6 + 1;
      if (iVar3 < 0) {
switchD_0024f2d5_caseD_65:
        iVar6 = -2;
        Abc_Print(-2,"usage: &fraig [-WRILDC <num>] [-rmdckngwvh]\n");
        Abc_Print(-2,"\t         performs combinational SAT sweeping\n");
        Abc_Print(-2,"\t-W num : the number of simulation words [default = %d]\n",
                  (ulong)(uint)ParsFra.nWords);
        Abc_Print(-2,"\t-R num : the number of simulation rounds [default = %d]\n",
                  (ulong)(uint)ParsFra.nRounds);
        Abc_Print(-2,"\t-I num : the number of sweeping iterations [default = %d]\n",
                  (ulong)(uint)ParsFra.nItersMax);
        Abc_Print(-2,"\t-L num : the max number of levels of nodes to consider [default = %d]\n",
                  (ulong)(uint)ParsFra.nLevelMax);
        Abc_Print(-2,"\t-D num : the max number of steps of speculative reduction [default = %d]\n",
                  (ulong)(uint)ParsFra.nDepthMax);
        Abc_Print(-2,"\t-C num : the max number of conflicts at a node [default = %d]\n",
                  (ulong)(uint)ParsFra.nBTLimit);
        pcVar7 = "yes";
        pcVar5 = "yes";
        if (ParsFra.fRewriting == 0) {
          pcVar5 = "no";
        }
        Abc_Print(-2,"\t-r     : toggle the use of AIG rewriting [default = %s]\n",pcVar5);
        pcVar5 = "miter";
        if (ParsFra.fCheckMiter == 0) {
          pcVar5 = "circuit";
        }
        Abc_Print(-2,"\t-m     : toggle miter vs. any circuit [default = %s]\n",pcVar5);
        pcVar5 = "yes";
        if (ParsFra.fDualOut == 0) {
          pcVar5 = "no";
        }
        Abc_Print(-2,"\t-d     : toggle using double output miters [default = %s]\n",pcVar5);
        pcVar5 = "yes";
        if (ParsFra.fRunCSat == 0) {
          pcVar5 = "no";
        }
        Abc_Print(-2,"\t-c     : toggle using circuit-based solver [default = %s]\n",pcVar5);
        pcVar5 = "yes";
        if (ParsFra.fUseCones == 0) {
          pcVar5 = "no";
        }
        Abc_Print(-2,"\t-k     : toggle using logic cones in the SAT solver [default = %s]\n",pcVar5
                 );
        pcVar5 = "yes";
        if (!bVar1) {
          pcVar5 = "no";
        }
        Abc_Print(-2,"\t-n     : toggle using new implementation [default = %s]\n",pcVar5);
        pcVar5 = "yes";
        if (!bVar2) {
          pcVar5 = "no";
        }
        Abc_Print(-2,"\t-g     : toggle using another new implementation [default = %s]\n",pcVar5);
        pcVar5 = "yes";
        if (ParsFra.fVeryVerbose == 0) {
          pcVar5 = "no";
        }
        Abc_Print(-2,"\t-w     : toggle printing even more verbose information [default = %s]\n",
                  pcVar5);
        if (ParsFra.fVerbose == 0) {
          pcVar7 = "no";
        }
        Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar7);
        pcVar5 = "\t-h     : print the command usage\n";
LAB_0024f62b:
        Abc_Print(iVar6,pcVar5);
        return 1;
      }
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Fraig( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Gia_Man_t * Cec2_ManSimulateTest( Gia_Man_t * p, Cec_ParFra_t * pPars );
    extern Gia_Man_t * Cec3_ManSimulateTest( Gia_Man_t * p, Cec_ParFra_t * pPars );
    Cec_ParFra_t ParsFra, * pPars = &ParsFra;
    Gia_Man_t * pTemp;
    int c, fUseAlgo = 0, fUseAlgoG = 0;
    Cec_ManFraSetDefaultParams( pPars );
    pPars->fSatSweeping = 1;
    pPars->nItersMax = 1000000;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "WRILDCrmdckngwvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nWords = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nWords < 0 )
                goto usage;
            break;
        case 'R':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-R\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nRounds = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nRounds < 0 )
                goto usage;
            break;
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nItersMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nItersMax < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nLevelMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nLevelMax < 0 )
                goto usage;
            break;
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nDepthMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nDepthMax < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBTLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBTLimit < 0 )
                goto usage;
            break;
        case 'r':
            pPars->fRewriting ^= 1;
            break;
        case 'm':
            pPars->fCheckMiter ^= 1;
            break;
        case 'd':
            pPars->fDualOut ^= 1;
            break;
        case 'c':
            pPars->fRunCSat ^= 1;
            break;
        case 'k':
            pPars->fUseCones ^= 1;
            break;
        case 'n':
            fUseAlgo ^= 1;
            break;
        case 'g':
            fUseAlgoG ^= 1;
            break;
        case 'w':
            pPars->fVeryVerbose ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Fraig(): There is no AIG.\n" );
        return 1;
    }
    if ( fUseAlgo )
        pTemp = Cec2_ManSimulateTest( pAbc->pGia, pPars );
    else if ( fUseAlgoG )
        pTemp = Cec3_ManSimulateTest( pAbc->pGia, pPars );
    else
        pTemp = Cec_ManSatSweeping( pAbc->pGia, pPars, 0 );
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &fraig [-WRILDC <num>] [-rmdckngwvh]\n" );
    Abc_Print( -2, "\t         performs combinational SAT sweeping\n" );
    Abc_Print( -2, "\t-W num : the number of simulation words [default = %d]\n", pPars->nWords );
    Abc_Print( -2, "\t-R num : the number of simulation rounds [default = %d]\n", pPars->nRounds );
    Abc_Print( -2, "\t-I num : the number of sweeping iterations [default = %d]\n", pPars->nItersMax );
    Abc_Print( -2, "\t-L num : the max number of levels of nodes to consider [default = %d]\n", pPars->nLevelMax );
    Abc_Print( -2, "\t-D num : the max number of steps of speculative reduction [default = %d]\n", pPars->nDepthMax );
    Abc_Print( -2, "\t-C num : the max number of conflicts at a node [default = %d]\n", pPars->nBTLimit );
    Abc_Print( -2, "\t-r     : toggle the use of AIG rewriting [default = %s]\n", pPars->fRewriting? "yes": "no" );
    Abc_Print( -2, "\t-m     : toggle miter vs. any circuit [default = %s]\n", pPars->fCheckMiter? "miter": "circuit" );
    Abc_Print( -2, "\t-d     : toggle using double output miters [default = %s]\n", pPars->fDualOut? "yes": "no" );
    Abc_Print( -2, "\t-c     : toggle using circuit-based solver [default = %s]\n", pPars->fRunCSat? "yes": "no" );
    Abc_Print( -2, "\t-k     : toggle using logic cones in the SAT solver [default = %s]\n", pPars->fUseCones? "yes": "no" );
    Abc_Print( -2, "\t-n     : toggle using new implementation [default = %s]\n", fUseAlgo? "yes": "no" );
    Abc_Print( -2, "\t-g     : toggle using another new implementation [default = %s]\n", fUseAlgoG? "yes": "no" );
    Abc_Print( -2, "\t-w     : toggle printing even more verbose information [default = %s]\n", pPars->fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}